

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_mp3.h
# Opt level: O0

float drmp3_L3_pow_43(int x)

{
  int iVar1;
  float fVar2;
  int local_1c;
  int mult;
  int sign;
  float frac;
  int x_local;
  
  local_1c = 0x100;
  if (x < 0x81) {
    frac = g_drmp3_pow43[x + 0x10];
  }
  else {
    sign = x;
    if (x < 0x400) {
      local_1c = 0x10;
      sign = x << 3;
    }
    iVar1 = (sign & 0x20U) * 2;
    fVar2 = (float)(int)((sign & 0x3fU) + (sign & 0x20U) * -2) /
            (float)(int)((sign & 0xffffffc0U) + iVar1);
    frac = g_drmp3_pow43[(sign + iVar1 >> 6) + 0x10] *
           (fVar2 * (fVar2 * 0.22222222 + 1.3333334) + 1.0) * (float)local_1c;
  }
  return frac;
}

Assistant:

static float drmp3_L3_pow_43(int x)
{
    float frac;
    int sign, mult = 256;

    if (x < 129)
    {
        return g_drmp3_pow43[16 + x];
    }

    if (x < 1024)
    {
        mult = 16;
        x <<= 3;
    }

    sign = 2*x & 64;
    frac = (float)((x & 63) - sign) / ((x & ~63) + sign);
    return g_drmp3_pow43[16 + ((x + sign) >> 6)]*(1.f + frac*((4.f/3) + frac*(2.f/9)))*mult;
}